

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O0

void __thiscall ncnn::PriorBox::PriorBox(PriorBox *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffffd0;
  
  Layer::Layer(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__PriorBox_001df078;
  Mat::Mat((Mat *)(in_RDI + 0x17));
  Mat::Mat((Mat *)(in_RDI + 0x1f));
  Mat::Mat((Mat *)(in_RDI + 0x27));
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

PriorBox::PriorBox()
{
    one_blob_only = false;
    support_inplace = false;
}